

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O2

ip_tables_t * parse_tables(char *path)

{
  list_head *plVar1;
  list_head *plVar2;
  code *pcVar3;
  _func_int_void_ptr_char_ptr_ptr *p_Var4;
  double dVar5;
  undefined8 __nptr;
  ip_target_map_t *piVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  FILE *__stream;
  ip_tables_t *piVar10;
  char *pcVar11;
  ip_chain_t *piVar12;
  ip_rule_t *ipr;
  list_head *plVar13;
  ip_target_t *piVar14;
  size_t sVar15;
  long lVar16;
  void *pvVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  ip_target_map_t *piVar21;
  long lVar22;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 uVar23;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 uVar24;
  ip_table_t *local_4d0;
  long *local_4c0;
  char name [32];
  ip_target_map_t *local_458;
  long local_450;
  char local_448 [16];
  char line [1024];
  
  __stream = fopen(path,"r");
  memset(line,0,0x400);
  if (__stream == (FILE *)0x0) {
    _log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    return (ip_tables_t *)0x0;
  }
  piVar10 = (ip_tables_t *)new(0x20);
  local_458 = (ip_target_map_t *)0x10e468;
  local_450 = 0x10e328;
  do {
    local_4d0 = (ip_table_t *)0x0;
    bVar20 = 0;
LAB_001038a7:
    do {
      bVar19 = bVar20;
      pcVar11 = fgets(line,0x400,__stream);
      if (pcVar11 == (char *)0x0) {
        return piVar10;
      }
      bVar20 = bVar19;
    } while (((line[0] == '#') || (line[0] == '\n')) ||
            (bVar20 = 0, (CONCAT71(line._1_7_,line[0]) == 0xa54494d4d4f43 & bVar19) != 0));
    if (line[0] != '*' || bVar19 != 0) {
      if ((~bVar19 & 1) != 0 || line[0] != ':') break;
      name[0x10] = '\0';
      name[0x11] = '\0';
      name[0x12] = '\0';
      name[0x13] = '\0';
      name[0x14] = '\0';
      name[0x15] = '\0';
      name[0x16] = '\0';
      name[0x17] = '\0';
      name[0x18] = '\0';
      name[0x19] = '\0';
      name[0x1a] = '\0';
      name[0x1b] = '\0';
      name[0x1c] = '\0';
      name[0x1d] = '\0';
      name[0x1e] = '\0';
      name[0x1f] = '\0';
      name[0] = '\0';
      name[1] = '\0';
      name[2] = '\0';
      name[3] = '\0';
      name[4] = '\0';
      name[5] = '\0';
      name[6] = '\0';
      name[7] = '\0';
      name[8] = '\0';
      name[9] = '\0';
      name[10] = '\0';
      name[0xb] = '\0';
      name[0xc] = '\0';
      name[0xd] = '\0';
      name[0xe] = '\0';
      name[0xf] = '\0';
      local_448[0] = '\0';
      local_448[1] = '\0';
      local_448[2] = '\0';
      local_448[3] = '\0';
      local_448[4] = '\0';
      local_448[5] = '\0';
      local_448[6] = '\0';
      local_448[7] = '\0';
      local_448[8] = '\0';
      local_448[9] = '\0';
      local_448[10] = '\0';
      local_448[0xb] = '\0';
      local_448[0xc] = '\0';
      local_448[0xd] = '\0';
      local_448[0xe] = '\0';
      local_448[0xf] = '\0';
      iVar8 = __isoc99_sscanf(line,":%31s %15s",name,local_448);
      uVar23 = extraout_XMM0_Da_00;
      uVar24 = extraout_XMM0_Db_00;
      if (iVar8 == 2) {
        piVar12 = (ip_chain_t *)new(0x48);
        _strlcpy((char *)piVar12,name,0x20);
        iVar8 = map_int_get_v(local_448,m_target);
        piVar12->policy = iVar8;
        plVar1 = &piVar12->list;
        (piVar12->list).prev = plVar1;
        (piVar12->list).next = plVar1;
        (piVar12->rules).prev = &piVar12->rules;
        (piVar12->rules).next = &piVar12->rules;
        iVar8 = map_int_get_v((char *)piVar12,m_chain);
        if (iVar8 == 5) {
          plVar13 = (local_4d0->child_chains).prev;
          (local_4d0->child_chains).prev = plVar1;
          (piVar12->list).next = &local_4d0->child_chains;
          (piVar12->list).prev = plVar13;
          plVar13->next = plVar1;
        }
        else {
          local_4d0->chains[iVar8] = piVar12;
        }
        goto LAB_00103f2d;
      }
      goto LAB_00103f11;
    }
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    name[8] = '\0';
    name[9] = '\0';
    name[10] = '\0';
    name[0xb] = '\0';
    name[0xc] = '\0';
    name[0xd] = '\0';
    name[0xe] = '\0';
    name[0xf] = '\0';
    iVar8 = __isoc99_sscanf(line,"*%15s",name);
    uVar23 = extraout_XMM0_Da_01;
    uVar24 = extraout_XMM0_Db_01;
    if (iVar8 == 1) {
      iVar8 = map_int_get_v(name,m_table);
      if (iVar8 != 4) {
        local_4d0 = (ip_table_t *)new(0x38);
        (local_4d0->child_chains).prev = &local_4d0->child_chains;
        (local_4d0->child_chains).next = &local_4d0->child_chains;
        piVar10->tables[iVar8] = local_4d0;
        goto LAB_00103f2d;
      }
      dVar5 = _log((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
      uVar23 = SUB84(dVar5,0);
      uVar24 = (undefined4)((ulong)dVar5 >> 0x20);
    }
    _log((double)CONCAT44(uVar24,uVar23));
  } while( true );
  bVar20 = 0;
  if (bVar19 != 0) {
    ipr = (ip_rule_t *)new(0x70);
    ipr->target = 6;
    plVar13 = &ipr->list;
    (ipr->list).prev = plVar13;
    (ipr->list).next = plVar13;
    plVar1 = &ipr->matchs;
    (ipr->matchs).prev = plVar1;
    (ipr->matchs).next = plVar1;
    pcVar11 = strtok(line," \t\n");
    local_4c0 = (long *)0x0;
    uVar23 = extraout_XMM0_Da_03;
    uVar24 = extraout_XMM0_Db_03;
    while (pcVar11 != (char *)0x0) {
      name._0_8_ = pcVar11;
      if (*pcVar11 != '-') {
        bVar19 = bVar20;
        if ((*pcVar11 == '!') && (pcVar11[1] == '\0')) {
          bVar19 = 1;
        }
        goto switchD_00103b86_caseD_65;
      }
      cVar7 = pcVar11[1];
      if ((cVar7 != '-') && (cVar7 != 'f')) {
        name._0_8_ = strtok((char *)0x0," \t\n");
        uVar23 = extraout_XMM0_Da_05;
        uVar24 = extraout_XMM0_Db_05;
        if ((char *)name._0_8_ != (char *)0x0) {
          cVar7 = pcVar11[1];
          goto LAB_00103b64;
        }
        goto LAB_00103ec2;
      }
LAB_00103b64:
      __nptr = name._0_8_;
      bVar19 = 0;
      switch(cVar7) {
      case 'd':
        iVar8 = parse_ip((char *)name._0_8_,&ipr->dst,&ipr->dmsk);
        bVar18 = 2;
        uVar23 = extraout_XMM0_Da_06;
        uVar24 = extraout_XMM0_Db_06;
        goto LAB_00103cc8;
      case 'e':
      case 'h':
      case 'k':
      case 'l':
      case 'n':
      case 'q':
      case 'r':
        break;
      case 'f':
        ipr->frag = '\x01';
        bVar18 = 0x20;
        goto LAB_00103d64;
      case 'g':
        piVar12 = find_chain((char *)name._0_8_,local_4d0);
        ipr->target_child = piVar12;
        uVar23 = extraout_XMM0_Da_08;
        uVar24 = extraout_XMM0_Db_08;
        if (piVar12 == (ip_chain_t *)0x0) goto LAB_00103ec2;
        ipr->target = 5;
        ipr->go = '\x01';
        break;
      case 'i':
        sVar15 = strlen((char *)name._0_8_);
        uVar23 = extraout_XMM0_Da_10;
        uVar24 = extraout_XMM0_Db_10;
        if (0xf < sVar15) goto LAB_00103ec2;
        _strlcpy(ipr->in,(char *)__nptr,0x10);
        bVar18 = 4;
        goto LAB_00103d64;
      case 'j':
        iVar8 = map_int_get_v((char *)name._0_8_,m_target);
        ipr->target = iVar8;
        piVar6 = local_458;
        if (iVar8 == 6) {
          do {
            piVar21 = piVar6;
            if (piVar21[1].name == (char *)0x0) {
              piVar12 = find_chain((char *)__nptr,local_4d0);
              ipr->target_child = piVar12;
              if (piVar12 != (ip_chain_t *)0x0) {
                ipr->target = 5;
                goto switchD_00103b86_caseD_65;
              }
              iVar8 = ipr->target;
              uVar23 = extraout_XMM0_Da_16;
              uVar24 = extraout_XMM0_Db_16;
              if (iVar8 != 6) goto LAB_00103e7b;
              goto LAB_00103ec2;
            }
            iVar8 = strcmp((char *)__nptr,piVar21[1].name);
            piVar6 = piVar21 + 1;
          } while (iVar8 != 0);
          piVar14 = (ip_target_t *)new(0x10);
          ipr->target_ext = piVar14;
          piVar14->map = piVar21 + 1;
          pvVar17 = new(piVar21[1].data_size);
          piVar14 = ipr->target_ext;
          piVar14->data = pvVar17;
          ipr->target = 4;
        }
        else {
LAB_00103e7b:
          if ((iVar8 != 4) || (piVar14 = ipr->target_ext, piVar14 == (ip_target_t *)0x0)) break;
        }
        if ((piVar14->map != (ip_target_map_t *)0x0) &&
           (p_Var4 = piVar14->map->func_parse, p_Var4 != (_func_int_void_ptr_char_ptr_ptr *)0x0)) {
          iVar8 = (*p_Var4)(piVar14->data,(char **)name);
          uVar23 = extraout_XMM0_Da_17;
          uVar24 = extraout_XMM0_Db_17;
LAB_00103eba:
          bVar19 = 0;
          if (iVar8 != 0) goto LAB_00103ec2;
        }
        break;
      case 'm':
        lVar16 = local_450;
        do {
          lVar22 = lVar16;
          if (*(char **)(lVar22 + 0x28) == (char *)0x0) goto LAB_00103ec2;
          iVar8 = strcmp((char *)__nptr,*(char **)(lVar22 + 0x28));
          lVar16 = lVar22 + 0x28;
          uVar23 = extraout_XMM0_Da_14;
          uVar24 = extraout_XMM0_Db_14;
        } while (iVar8 != 0);
        local_4c0 = (long *)new(0x20);
        *local_4c0 = lVar22 + 0x28;
        pvVar17 = new(*(size_t *)(lVar22 + 0x30));
        local_4c0[1] = (long)pvVar17;
        plVar2 = (ipr->matchs).prev;
        (ipr->matchs).prev = (list_head *)(local_4c0 + 2);
        local_4c0[2] = (long)plVar1;
        local_4c0[3] = (long)plVar2;
        plVar2->next = (list_head *)(local_4c0 + 2);
        break;
      case 'o':
        sVar15 = strlen((char *)name._0_8_);
        uVar23 = extraout_XMM0_Da_11;
        uVar24 = extraout_XMM0_Db_11;
        if (0xf < sVar15) goto LAB_00103ec2;
        _strlcpy(ipr->out,(char *)__nptr,0x10);
        bVar18 = 8;
        goto LAB_00103d64;
      case 'p':
        uVar9 = map_int_get_v((char *)name._0_8_,m_proto);
        uVar23 = extraout_XMM0_Da_12;
        uVar24 = extraout_XMM0_Db_12;
        if (uVar9 == 0xffffffff) {
          lVar16 = strtol((char *)__nptr,(char **)0x0,10);
          uVar9 = (uint)lVar16;
          uVar23 = extraout_XMM0_Da_13;
          uVar24 = extraout_XMM0_Db_13;
        }
        if (0xff < uVar9) goto LAB_00103ec2;
        ipr->proto = (uint8_t)uVar9;
        bVar18 = 0x10;
        goto LAB_00103d64;
      case 's':
        iVar8 = parse_ip((char *)name._0_8_,&ipr->src,&ipr->smsk);
        bVar18 = 1;
        uVar23 = extraout_XMM0_Da_09;
        uVar24 = extraout_XMM0_Db_09;
LAB_00103cc8:
        if (iVar8 != 0) {
LAB_00103ec2:
          _log((double)CONCAT44(uVar24,uVar23));
          free_rule(ipr);
          uVar23 = extraout_XMM0_Da_18;
          uVar24 = extraout_XMM0_Db_18;
          goto LAB_00103f11;
        }
LAB_00103d64:
        if ((ipr != (ip_rule_t *)0x0) && (bVar20 != 0)) {
          ipr->invert = ipr->invert | bVar18;
        }
        break;
      default:
        if (cVar7 == '-') {
          if (local_4c0 == (long *)0x0) {
            local_4c0 = (long *)0x0;
            bVar19 = 0;
          }
          else if (*local_4c0 == 0) {
            bVar19 = 0;
          }
          else {
            pcVar3 = *(code **)(*local_4c0 + 0x18);
            bVar19 = 0;
            if (pcVar3 != (code *)0x0) {
              iVar8 = (*pcVar3)(local_4c0[1],name,bVar20);
              uVar23 = extraout_XMM0_Da_15;
              uVar24 = extraout_XMM0_Db_15;
              goto LAB_00103eba;
            }
          }
        }
        else {
          bVar19 = 0;
          if (cVar7 == 'A') {
            piVar12 = find_chain((char *)name._0_8_,local_4d0);
            ipr->chain = piVar12;
            uVar23 = extraout_XMM0_Da_07;
            uVar24 = extraout_XMM0_Db_07;
            if (piVar12 == (ip_chain_t *)0x0) goto LAB_00103ec2;
            plVar2 = (piVar12->rules).prev;
            (piVar12->rules).prev = plVar13;
            (ipr->list).next = &piVar12->rules;
            (ipr->list).prev = plVar2;
            plVar2->next = plVar13;
          }
        }
      }
switchD_00103b86_caseD_65:
      bVar20 = bVar19;
      pcVar11 = strtok((char *)0x0," \t\n");
      uVar23 = extraout_XMM0_Da_04;
      uVar24 = extraout_XMM0_Db_04;
    }
    bVar20 = 1;
    if (ipr == (ip_rule_t *)0x0) {
LAB_00103f11:
      _log((double)CONCAT44(uVar24,uVar23));
LAB_00103f2d:
      bVar20 = 1;
    }
  }
  goto LAB_001038a7;
}

Assistant:

ip_tables_t *parse_tables(const char *path)
{
	FILE *fp = fopen(path, "r");
	char line[1024] = {0};
	int line_num = 0, in_table = 0;

	ip_tables_t *ipts = NULL;
	ip_table_t *ipt = NULL;

	if (fp == NULL) {
		log_err("open file \"%s\" failed: %m\n", path);
		return NULL;
	}

	ipts = _new(ip_tables_t);

	while (fgets(line, sizeof(line), fp) != NULL) {
		line_num++;

		if (line[0] == '#' || line[0] == '\n') {
			continue;

		} else if (strcmp(line, "COMMIT\n") == 0 && in_table) {
			in_table = 0;

		} else if (line[0] == '*' && !in_table) {
			if ((ipt = parse_table(line, ipts)) == NULL) {
				log_err("line: %d parse table failed\n", line_num);
			} else {
				in_table = 1;
			}

		} else if (line[0] == ':' && in_table) {
			if (parse_chain(line, ipt) == NULL) {
				log_err("line: %d parse chain failed\n", line_num);
			}

		} else if (in_table) {
			if (parse_rule(line, ipt) == NULL) {
				log_err("line: %d parse rule failed\n", line_num);
			}
		}
	}

	return ipts;
}